

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_render.cpp
# Opt level: O2

void __thiscall OpacityTextures::check(OpacityTextures *this)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  ostream *poVar4;
  uint uVar5;
  int iVar6;
  float fVar7;
  vec4 vVar8;
  vec4 v;
  vec4 v_00;
  vec4 v_01;
  vec4 v_02;
  vec4 v_03;
  vec4 v_04;
  vec4 v_05;
  vec4 v_06;
  vec4 v_07;
  vec4 b;
  vec4 b_00;
  vec4 b_01;
  vec4 b_02;
  vec4 b_03;
  vec4 b_04;
  vec4 b_05;
  vec4 b_06;
  vec4 b_07;
  vec4 b_08;
  ostream *poStack_40;
  
  if ((this->super_StaticRenderTest).m_w < 10) {
LAB_0011dd96:
    pcVar3 = "x1-1 < m_w";
    goto LAB_0011e00f;
  }
  if ((this->super_StaticRenderTest).m_h < 10) {
LAB_0011dd72:
    pcVar3 = "y1-1 < m_h";
  }
  else {
    vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,9,9);
    bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
    if (bVar1) {
      if ((this->super_StaticRenderTest).m_w < 0x16) {
LAB_0011dd8a:
        pcVar3 = "x2+1 < m_w";
        goto LAB_0011e00f;
      }
      if ((this->super_StaticRenderTest).m_h < 10) goto LAB_0011dd72;
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x15,9);
      bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,21.0);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,9.0);
        poVar2 = std::operator<<(poVar2,")=");
        poStack_40 = (ostream *)0x15;
        uVar5 = 9;
        goto LAB_0011e636;
      }
      if ((this->super_StaticRenderTest).m_w < 10) goto LAB_0011dd96;
      if ((this->super_StaticRenderTest).m_h < 0x16) {
LAB_0011dd7e:
        pcVar3 = "y2+1 < m_h";
        goto LAB_0011e00f;
      }
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,9,0x15);
      bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,9.0);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,21.0);
        poVar2 = std::operator<<(poVar2,")=");
        poStack_40 = (ostream *)0x9;
        uVar5 = 0x15;
        goto LAB_0011e636;
      }
      if ((this->super_StaticRenderTest).m_w < 0x16) goto LAB_0011dd8a;
      if ((this->super_StaticRenderTest).m_h < 0x16) goto LAB_0011dd7e;
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x15,0x15);
      bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,21.0);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,21.0);
        poVar2 = std::operator<<(poVar2,")=");
        uVar5 = 0x15;
        goto LAB_0011e630;
      }
      for (fVar7 = 10.0; fVar7 <= 20.0; fVar7 = fVar7 + 1.0) {
        if (fVar7 < 0.0) {
          pcVar3 = "x >= 0";
          goto LAB_0011e00f;
        }
        if ((float)(this->super_StaticRenderTest).m_w <= fVar7) {
LAB_0011dd2a:
          pcVar3 = "x < m_w";
          goto LAB_0011e00f;
        }
        if ((this->super_StaticRenderTest).m_h < 10) goto LAB_0011dd72;
        uVar5 = (uint)fVar7;
        vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,uVar5,9);
        bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar7);
          poVar2 = std::operator<<(poVar2,",");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,9.0);
          poVar2 = std::operator<<(poVar2,")=");
          iVar6 = 9;
LAB_0011dee0:
          poStack_40 = (ostream *)(ulong)uVar5;
          goto LAB_0011dfd1;
        }
        if ((float)(this->super_StaticRenderTest).m_w <= fVar7) goto LAB_0011dd2a;
        if ((this->super_StaticRenderTest).m_h < 0x16) goto LAB_0011dd7e;
        vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,uVar5,0x15);
        bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar7);
          poVar2 = std::operator<<(poVar2,",");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,21.0);
          poVar2 = std::operator<<(poVar2,")=");
          iVar6 = 0x15;
          goto LAB_0011dee0;
        }
      }
      fVar7 = 10.0;
LAB_0011d24d:
      iVar6 = (this->super_StaticRenderTest).m_w;
      if (20.0 < fVar7) goto LAB_0011d316;
      if (iVar6 < 10) goto LAB_0011dd96;
      if (fVar7 < 0.0) {
        pcVar3 = "y >= 0";
        goto LAB_0011e00f;
      }
      if ((float)(this->super_StaticRenderTest).m_h <= fVar7) {
LAB_0011dd36:
        pcVar3 = "y < m_h";
        goto LAB_0011e00f;
      }
      iVar6 = (int)fVar7;
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,9,iVar6);
      bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
      if (bVar1) {
        if ((this->super_StaticRenderTest).m_w < 0x16) goto LAB_0011dd8a;
        if ((float)(this->super_StaticRenderTest).m_h <= fVar7) goto LAB_0011dd36;
        vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x15,iVar6);
        bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,21.0);
          poVar2 = std::operator<<(poVar2,",");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar7);
          poVar2 = std::operator<<(poVar2,")=");
          poStack_40 = (ostream *)0x15;
          goto LAB_0011dfd1;
        }
        fVar7 = fVar7 + 1.0;
        goto LAB_0011d24d;
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,9.0);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar7);
      poVar2 = std::operator<<(poVar2,")=");
      poStack_40 = (ostream *)0x9;
LAB_0011dfd1:
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,(int)poStack_40,iVar6);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,9.0);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,9.0);
      poVar2 = std::operator<<(poVar2,")=");
      uVar5 = 9;
LAB_0011e630:
      poStack_40 = (ostream *)(ulong)uVar5;
LAB_0011e636:
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,(int)poStack_40,uVar5);
    }
    poVar2 = rengine::operator<<((rengine *)poVar2,poStack_40,vVar8);
    pcVar3 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,
                                 (vec4)(ZEXT816(0x3f80000000000000) << 0x40));
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "false";
  }
LAB_0011e00f:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                ,0xbb,"virtual void OpacityTextures::check()");
LAB_0011d316:
  if (iVar6 < 0xb) {
    pcVar3 = "10 < m_w";
LAB_0011e70a:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbc,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xb) {
    pcVar3 = "10 < m_h";
    goto LAB_0011e70a;
  }
  vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,10,10);
  b.z = 0.0;
  b.w = 1.0;
  b.x = 0.5;
  b.y = 0.0;
  bVar1 = rengine::fuzzy_equals(vVar8,b,0.01);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,10);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,10);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0xa;
    vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,10,10);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,vVar8);
    pcVar3 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    vVar8.z = 0.0;
    vVar8.w = 1.0;
    vVar8.x = 0.5;
    vVar8.y = 0.0;
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,vVar8);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "false";
    goto LAB_0011e70a;
  }
  if ((this->super_StaticRenderTest).m_w < 0xc) {
    pcVar3 = "11 < m_w";
LAB_0011e7ed:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbd,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xb) {
    pcVar3 = "10 < m_h";
    goto LAB_0011e7ed;
  }
  vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,10);
  b_00.z = 0.0;
  b_00.w = 1.0;
  b_00.x = 0.5;
  b_00.y = 0.0;
  bVar1 = rengine::fuzzy_equals(vVar8,b_00,0.01);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,10);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0xb;
    vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,10);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,vVar8);
    pcVar3 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    v.z = 0.0;
    v.w = 1.0;
    v.x = 0.5;
    v.y = 0.0;
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,v);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "false";
    goto LAB_0011e7ed;
  }
  if ((this->super_StaticRenderTest).m_w < 0xb) {
    pcVar3 = "10 < m_w";
LAB_0011e8d0:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbe,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xc) {
    pcVar3 = "11 < m_h";
    goto LAB_0011e8d0;
  }
  vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,10,0xb);
  b_01.z = 0.0;
  b_01.w = 1.0;
  b_01.x = 0.5;
  b_01.y = 0.0;
  bVar1 = rengine::fuzzy_equals(vVar8,b_01,0.01);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,10);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0xa;
    vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,10,0xb);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,vVar8);
    pcVar3 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    v_00.z = 0.0;
    v_00.w = 1.0;
    v_00.x = 0.5;
    v_00.y = 0.0;
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,v_00);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "false";
    goto LAB_0011e8d0;
  }
  if ((this->super_StaticRenderTest).m_w < 0xc) {
    pcVar3 = "11 < m_w";
LAB_0011e9aa:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbf,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xc) {
    pcVar3 = "11 < m_h";
    goto LAB_0011e9aa;
  }
  vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,0xb);
  bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f8000003f000000) << 0x40),0.01);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0xb;
    vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,0xb);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,vVar8);
    pcVar3 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,
                                 (vec4)(ZEXT816(0x3f8000003f000000) << 0x40));
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "false";
    goto LAB_0011e9aa;
  }
  if ((this->super_StaticRenderTest).m_w < 0xc) {
    pcVar3 = "11 < m_w";
LAB_0011ea88:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc0,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xd) {
    pcVar3 = "12 < m_h";
    goto LAB_0011ea88;
  }
  vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,0xc);
  bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f8000003f000000) << 0x40),0.01);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0xb;
    vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,0xc);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,vVar8);
    pcVar3 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,
                                 (vec4)(ZEXT816(0x3f8000003f000000) << 0x40));
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "false";
    goto LAB_0011ea88;
  }
  if ((this->super_StaticRenderTest).m_w < 0xd) {
    pcVar3 = "12 < m_w";
LAB_0011eb66:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc1,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xc) {
    pcVar3 = "11 < m_h";
    goto LAB_0011eb66;
  }
  vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xc,0xb);
  bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f8000003f000000) << 0x40),0.01);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0xc;
    vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xc,0xb);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,vVar8);
    pcVar3 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,
                                 (vec4)(ZEXT816(0x3f8000003f000000) << 0x40));
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "false";
    goto LAB_0011eb66;
  }
  if ((this->super_StaticRenderTest).m_w < 0x1f) {
LAB_0011ddc6:
    pcVar3 = "x1-1 < m_w";
    goto LAB_0011e234;
  }
  if ((this->super_StaticRenderTest).m_h < 0xb) {
LAB_0011dda2:
    pcVar3 = "y1-1 < m_h";
  }
  else {
    vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1e,10);
    bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
    if (bVar1) {
      if ((this->super_StaticRenderTest).m_w < 0x2b) {
LAB_0011ddba:
        pcVar3 = "x2+1 < m_w";
        goto LAB_0011e234;
      }
      if ((this->super_StaticRenderTest).m_h < 0xb) goto LAB_0011dda2;
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x2a,10);
      bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,42.0);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,10.0);
        poVar2 = std::operator<<(poVar2,")=");
        poStack_40 = (ostream *)0x2a;
        goto LAB_0011ec56;
      }
      if ((this->super_StaticRenderTest).m_w < 0x1f) goto LAB_0011ddc6;
      if ((this->super_StaticRenderTest).m_h < 0x17) {
LAB_0011ddae:
        pcVar3 = "y2+1 < m_h";
        goto LAB_0011e234;
      }
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1e,0x16);
      bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,30.0);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,22.0);
        poVar2 = std::operator<<(poVar2,")=");
        poStack_40 = (ostream *)0x1e;
LAB_0011ed36:
        iVar6 = 0x16;
        goto LAB_0011ed39;
      }
      if ((this->super_StaticRenderTest).m_w < 0x2b) goto LAB_0011ddba;
      if ((this->super_StaticRenderTest).m_h < 0x17) goto LAB_0011ddae;
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x2a,0x16);
      bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,42.0);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,22.0);
        poVar2 = std::operator<<(poVar2,")=");
        poStack_40 = (ostream *)0x2a;
        goto LAB_0011ed36;
      }
      for (fVar7 = 31.0; fVar7 <= 41.0; fVar7 = fVar7 + 1.0) {
        if (fVar7 < 0.0) {
          pcVar3 = "x >= 0";
          goto LAB_0011e234;
        }
        if ((float)(this->super_StaticRenderTest).m_w <= fVar7) {
LAB_0011dd42:
          pcVar3 = "x < m_w";
          goto LAB_0011e234;
        }
        if ((this->super_StaticRenderTest).m_h < 0xb) goto LAB_0011dda2;
        uVar5 = (uint)fVar7;
        vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,uVar5,10);
        bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar7);
          poVar2 = std::operator<<(poVar2,",");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,10.0);
          poVar2 = std::operator<<(poVar2,")=");
          iVar6 = 10;
LAB_0011e105:
          poStack_40 = (ostream *)(ulong)uVar5;
          goto LAB_0011e1f6;
        }
        if ((float)(this->super_StaticRenderTest).m_w <= fVar7) goto LAB_0011dd42;
        if ((this->super_StaticRenderTest).m_h < 0x17) goto LAB_0011ddae;
        vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,uVar5,0x16);
        bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar7);
          poVar2 = std::operator<<(poVar2,",");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,22.0);
          poVar2 = std::operator<<(poVar2,")=");
          iVar6 = 0x16;
          goto LAB_0011e105;
        }
      }
      fVar7 = 11.0;
LAB_0011d6a1:
      iVar6 = (this->super_StaticRenderTest).m_w;
      if (21.0 < fVar7) goto LAB_0011d76a;
      if (iVar6 < 0x1f) goto LAB_0011ddc6;
      if (fVar7 < 0.0) {
        pcVar3 = "y >= 0";
        goto LAB_0011e234;
      }
      if ((float)(this->super_StaticRenderTest).m_h <= fVar7) {
LAB_0011dd4e:
        pcVar3 = "y < m_h";
        goto LAB_0011e234;
      }
      iVar6 = (int)fVar7;
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1e,iVar6);
      bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
      if (bVar1) {
        if ((this->super_StaticRenderTest).m_w < 0x2b) goto LAB_0011ddba;
        if ((float)(this->super_StaticRenderTest).m_h <= fVar7) goto LAB_0011dd4e;
        vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x2a,iVar6);
        bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,42.0);
          poVar2 = std::operator<<(poVar2,",");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar7);
          poVar2 = std::operator<<(poVar2,")=");
          poStack_40 = (ostream *)0x2a;
          goto LAB_0011e1f6;
        }
        fVar7 = fVar7 + 1.0;
        goto LAB_0011d6a1;
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,30.0);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar7);
      poVar2 = std::operator<<(poVar2,")=");
      poStack_40 = (ostream *)0x1e;
LAB_0011e1f6:
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,(int)poStack_40,iVar6);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,30.0);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,10.0);
      poVar2 = std::operator<<(poVar2,")=");
      poStack_40 = (ostream *)0x1e;
LAB_0011ec56:
      iVar6 = 10;
LAB_0011ed39:
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,(int)poStack_40,iVar6);
    }
    poVar2 = rengine::operator<<((rengine *)poVar2,poStack_40,vVar8);
    pcVar3 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,
                                 (vec4)(ZEXT816(0x3f80000000000000) << 0x40));
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "false";
  }
LAB_0011e234:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                ,0xc3,"virtual void OpacityTextures::check()");
LAB_0011d76a:
  if (iVar6 < 0x20) {
    pcVar3 = "31 < m_w";
LAB_0011ee15:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc4,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xc) {
    pcVar3 = "11 < m_h";
    goto LAB_0011ee15;
  }
  vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1f,0xb);
  b_02.z = 0.0;
  b_02.w = 1.0;
  b_02.x = 0.0;
  b_02.y = 0.5;
  bVar1 = rengine::fuzzy_equals(vVar8,b_02,0.01);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1f);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x1f;
    vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1f,0xb);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,vVar8);
    pcVar3 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    v_01.z = 0.0;
    v_01.w = 1.0;
    v_01.x = 0.0;
    v_01.y = 0.5;
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,v_01);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "false";
    goto LAB_0011ee15;
  }
  if ((this->super_StaticRenderTest).m_w < 0x21) {
    pcVar3 = "32 < m_w";
LAB_0011eef8:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc5,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xc) {
    pcVar3 = "11 < m_h";
    goto LAB_0011eef8;
  }
  vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xb);
  b_03.z = 0.0;
  b_03.w = 1.0;
  b_03.x = 0.0;
  b_03.y = 0.5;
  bVar1 = rengine::fuzzy_equals(vVar8,b_03,0.01);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x20);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x20;
    vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xb);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,vVar8);
    pcVar3 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    v_02.z = 0.0;
    v_02.w = 1.0;
    v_02.x = 0.0;
    v_02.y = 0.5;
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,v_02);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "false";
    goto LAB_0011eef8;
  }
  if ((this->super_StaticRenderTest).m_w < 0x20) {
    pcVar3 = "31 < m_w";
LAB_0011efdb:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc6,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xd) {
    pcVar3 = "12 < m_h";
    goto LAB_0011efdb;
  }
  vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1f,0xc);
  b_04.z = 0.0;
  b_04.w = 1.0;
  b_04.x = 0.0;
  b_04.y = 0.5;
  bVar1 = rengine::fuzzy_equals(vVar8,b_04,0.01);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1f);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x1f;
    vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1f,0xc);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,vVar8);
    pcVar3 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    v_03.z = 0.0;
    v_03.w = 1.0;
    v_03.x = 0.0;
    v_03.y = 0.5;
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,v_03);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "false";
    goto LAB_0011efdb;
  }
  if ((this->super_StaticRenderTest).m_w < 0x21) {
    pcVar3 = "32 < m_w";
LAB_0011f0be:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,199,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xd) {
    pcVar3 = "12 < m_h";
    goto LAB_0011f0be;
  }
  vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xc);
  b_05.z = 0.0;
  b_05.w = 1.0;
  b_05.x = 0.5;
  b_05.y = 0.0;
  bVar1 = rengine::fuzzy_equals(vVar8,b_05,0.01);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x20);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x20;
    vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xc);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,vVar8);
    pcVar3 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    v_04.z = 0.0;
    v_04.w = 1.0;
    v_04.x = 0.5;
    v_04.y = 0.0;
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,v_04);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "false";
    goto LAB_0011f0be;
  }
  if ((this->super_StaticRenderTest).m_w < 0x22) {
    pcVar3 = "33 < m_w";
LAB_0011f1a1:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,200,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xd) {
    pcVar3 = "12 < m_h";
    goto LAB_0011f1a1;
  }
  vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x21,0xc);
  b_06.z = 0.0;
  b_06.w = 1.0;
  b_06.x = 0.5;
  b_06.y = 0.0;
  bVar1 = rengine::fuzzy_equals(vVar8,b_06,0.01);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x21);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x21;
    vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x21,0xc);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,vVar8);
    pcVar3 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    v_05.z = 0.0;
    v_05.w = 1.0;
    v_05.x = 0.5;
    v_05.y = 0.0;
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,v_05);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "false";
    goto LAB_0011f1a1;
  }
  if ((this->super_StaticRenderTest).m_w < 0x21) {
    pcVar3 = "32 < m_w";
LAB_0011f284:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc9,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xe) {
    pcVar3 = "13 < m_h";
    goto LAB_0011f284;
  }
  vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xd);
  b_07.z = 0.0;
  b_07.w = 1.0;
  b_07.x = 0.5;
  b_07.y = 0.0;
  bVar1 = rengine::fuzzy_equals(vVar8,b_07,0.01);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x20);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xd);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x20;
    vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xd);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,vVar8);
    pcVar3 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    v_06.z = 0.0;
    v_06.w = 1.0;
    v_06.x = 0.5;
    v_06.y = 0.0;
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,v_06);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "false";
    goto LAB_0011f284;
  }
  if ((this->super_StaticRenderTest).m_w < 100) {
LAB_0011ddf6:
    pcVar3 = "x1-1 < m_w";
    goto LAB_0011e459;
  }
  if ((this->super_StaticRenderTest).m_h < 10) {
LAB_0011ddd2:
    pcVar3 = "y1-1 < m_h";
  }
  else {
    vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,99,9);
    bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
    if (bVar1) {
      if ((this->super_StaticRenderTest).m_w < 0x70) {
LAB_0011ddea:
        pcVar3 = "x2+1 < m_w";
        goto LAB_0011e459;
      }
      if ((this->super_StaticRenderTest).m_h < 10) goto LAB_0011ddd2;
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x6f,9);
      bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,111.0);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,9.0);
        poVar2 = std::operator<<(poVar2,")=");
        poStack_40 = (ostream *)0x6f;
        goto LAB_0011f374;
      }
      if ((this->super_StaticRenderTest).m_w < 100) goto LAB_0011ddf6;
      if ((this->super_StaticRenderTest).m_h < 0x16) {
LAB_0011ddde:
        pcVar3 = "y2+1 < m_h";
        goto LAB_0011e459;
      }
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,99,0x15);
      bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,99.0);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,21.0);
        poVar2 = std::operator<<(poVar2,")=");
        poStack_40 = (ostream *)0x63;
LAB_0011f454:
        iVar6 = 0x15;
        goto LAB_0011f457;
      }
      if ((this->super_StaticRenderTest).m_w < 0x70) goto LAB_0011ddea;
      if ((this->super_StaticRenderTest).m_h < 0x16) goto LAB_0011ddde;
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x6f,0x15);
      bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,111.0);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,21.0);
        poVar2 = std::operator<<(poVar2,")=");
        poStack_40 = (ostream *)0x6f;
        goto LAB_0011f454;
      }
      for (fVar7 = 100.0; fVar7 <= 110.0; fVar7 = fVar7 + 1.0) {
        if (fVar7 < 0.0) {
          pcVar3 = "x >= 0";
          goto LAB_0011e459;
        }
        if ((float)(this->super_StaticRenderTest).m_w <= fVar7) {
LAB_0011dd5a:
          pcVar3 = "x < m_w";
          goto LAB_0011e459;
        }
        if ((this->super_StaticRenderTest).m_h < 10) goto LAB_0011ddd2;
        uVar5 = (uint)fVar7;
        vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,uVar5,9);
        bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar7);
          poVar2 = std::operator<<(poVar2,",");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,9.0);
          poVar2 = std::operator<<(poVar2,")=");
          iVar6 = 9;
LAB_0011e32a:
          poStack_40 = (ostream *)(ulong)uVar5;
          goto LAB_0011e41b;
        }
        if ((float)(this->super_StaticRenderTest).m_w <= fVar7) goto LAB_0011dd5a;
        if ((this->super_StaticRenderTest).m_h < 0x16) goto LAB_0011ddde;
        vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,uVar5,0x15);
        bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar7);
          poVar2 = std::operator<<(poVar2,",");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,21.0);
          poVar2 = std::operator<<(poVar2,")=");
          iVar6 = 0x15;
          goto LAB_0011e32a;
        }
      }
      fVar7 = 10.0;
LAB_0011db06:
      iVar6 = (this->super_StaticRenderTest).m_w;
      if (20.0 < fVar7) {
        if (iVar6 < 0x65) {
          pcVar3 = "100 < m_w";
        }
        else if ((this->super_StaticRenderTest).m_h < 0xb) {
          pcVar3 = "10 < m_h";
        }
        else {
          vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,100,10);
          b_08.z = 0.0;
          b_08.w = 1.0;
          b_08.x = 0.64;
          b_08.y = 0.0;
          bVar1 = rengine::fuzzy_equals(vVar8,b_08,0.01);
          if (bVar1) {
            if ((this->super_StaticRenderTest).m_w < 0x66) {
              pcVar3 = "101 < m_w";
            }
            else if ((this->super_StaticRenderTest).m_h < 0xc) {
              pcVar3 = "11 < m_h";
            }
            else {
              vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x65,0xb);
              bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f8000003f23d70a) << 0x40),0.01);
              if (bVar1) {
                if ((this->super_StaticRenderTest).m_w < 0x6f) {
                  pcVar3 = "110 < m_w";
                }
                else if ((this->super_StaticRenderTest).m_h < 0x15) {
                  pcVar3 = "20 < m_h";
                }
                else {
                  vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x6e,0x14);
                  bVar1 = rengine::fuzzy_equals
                                    (vVar8,(vec4)(ZEXT816(0x3f8000003f23d70a) << 0x40),0.01);
                  if (bVar1) {
                    if ((this->super_StaticRenderTest).m_w < 0x6f) {
                      pcVar3 = "110 < m_w";
                    }
                    else if ((this->super_StaticRenderTest).m_h < 0xb) {
                      pcVar3 = "10 < m_h";
                    }
                    else {
                      vVar8 = rengine::StaticRenderTest::pixel
                                        (&this->super_StaticRenderTest,0x6e,10);
                      bVar1 = rengine::fuzzy_equals
                                        (vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
                      if (bVar1) {
                        if ((this->super_StaticRenderTest).m_w < 0x65) {
                          pcVar3 = "100 < m_w";
                        }
                        else if ((this->super_StaticRenderTest).m_h < 0x15) {
                          pcVar3 = "20 < m_h";
                        }
                        else {
                          vVar8 = rengine::StaticRenderTest::pixel
                                            (&this->super_StaticRenderTest,100,0x14);
                          bVar1 = rengine::fuzzy_equals
                                            (vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01)
                          ;
                          if (bVar1) {
                            return;
                          }
                          poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) &
                               0xffffffb5 | 2;
                          poVar2 = (ostream *)std::ostream::operator<<(poVar2,100);
                          poVar2 = std::operator<<(poVar2,",");
                          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x14);
                          poVar2 = std::operator<<(poVar2,")=");
                          poVar4 = (ostream *)0x64;
                          vVar8 = rengine::StaticRenderTest::pixel
                                            (&this->super_StaticRenderTest,100,0x14);
                          poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,vVar8);
                          pcVar3 = "; expected=";
                          poVar2 = std::operator<<(poVar2,"; expected=");
                          poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,
                                                       (vec4)(ZEXT816(0x3f80000000000000) << 0x40));
                          std::endl<char,std::char_traits<char>>(poVar2);
                          pcVar3 = "false";
                        }
                        __assert_fail(pcVar3,
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                      ,0xd0,"virtual void OpacityTextures::check()");
                      }
                      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) &
                           0xffffffb5 | 2;
                      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x6e);
                      poVar2 = std::operator<<(poVar2,",");
                      poVar2 = (ostream *)std::ostream::operator<<(poVar2,10);
                      poVar2 = std::operator<<(poVar2,")=");
                      poVar4 = (ostream *)0x6e;
                      vVar8 = rengine::StaticRenderTest::pixel
                                        (&this->super_StaticRenderTest,0x6e,10);
                      poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,vVar8);
                      pcVar3 = "; expected=";
                      poVar2 = std::operator<<(poVar2,"; expected=");
                      poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,
                                                   (vec4)(ZEXT816(0x3f80000000000000) << 0x40));
                      std::endl<char,std::char_traits<char>>(poVar2);
                      pcVar3 = "false";
                    }
                    __assert_fail(pcVar3,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                  ,0xcf,"virtual void OpacityTextures::check()");
                  }
                  poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 |
                       2;
                  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x6e);
                  poVar2 = std::operator<<(poVar2,",");
                  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x14);
                  poVar2 = std::operator<<(poVar2,")=");
                  poVar4 = (ostream *)0x6e;
                  vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x6e,0x14);
                  poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,vVar8);
                  pcVar3 = "; expected=";
                  poVar2 = std::operator<<(poVar2,"; expected=");
                  poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,
                                               (vec4)(ZEXT816(0x3f8000003f23d70a) << 0x40));
                  std::endl<char,std::char_traits<char>>(poVar2);
                  pcVar3 = "false";
                }
                __assert_fail(pcVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                              ,0xce,"virtual void OpacityTextures::check()");
              }
              poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
              *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                   *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x65);
              poVar2 = std::operator<<(poVar2,",");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb);
              poVar2 = std::operator<<(poVar2,")=");
              poVar4 = (ostream *)0x65;
              vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x65,0xb);
              poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,vVar8);
              pcVar3 = "; expected=";
              poVar2 = std::operator<<(poVar2,"; expected=");
              poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,
                                           (vec4)(ZEXT816(0x3f8000003f23d70a) << 0x40));
              std::endl<char,std::char_traits<char>>(poVar2);
              pcVar3 = "false";
            }
            __assert_fail(pcVar3,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                          ,0xcd,"virtual void OpacityTextures::check()");
          }
          poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,100);
          poVar2 = std::operator<<(poVar2,",");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,10);
          poVar2 = std::operator<<(poVar2,")=");
          poVar4 = (ostream *)0x64;
          vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,100,10);
          poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,vVar8);
          pcVar3 = "; expected=";
          poVar2 = std::operator<<(poVar2,"; expected=");
          v_07.z = 0.0;
          v_07.w = 1.0;
          v_07.x = 0.64;
          v_07.y = 0.0;
          poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,v_07);
          std::endl<char,std::char_traits<char>>(poVar2);
          pcVar3 = "false";
        }
        __assert_fail(pcVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                      ,0xcc,"virtual void OpacityTextures::check()");
      }
      if (iVar6 < 100) goto LAB_0011ddf6;
      if (fVar7 < 0.0) {
        pcVar3 = "y >= 0";
        goto LAB_0011e459;
      }
      if ((float)(this->super_StaticRenderTest).m_h <= fVar7) {
LAB_0011dd66:
        pcVar3 = "y < m_h";
        goto LAB_0011e459;
      }
      iVar6 = (int)fVar7;
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,99,iVar6);
      bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
      if (bVar1) {
        if ((this->super_StaticRenderTest).m_w < 0x70) goto LAB_0011ddea;
        if ((float)(this->super_StaticRenderTest).m_h <= fVar7) goto LAB_0011dd66;
        vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x6f,iVar6);
        bVar1 = rengine::fuzzy_equals(vVar8,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,111.0);
          poVar2 = std::operator<<(poVar2,",");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar7);
          poVar2 = std::operator<<(poVar2,")=");
          poStack_40 = (ostream *)0x6f;
          goto LAB_0011e41b;
        }
        fVar7 = fVar7 + 1.0;
        goto LAB_0011db06;
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,99.0);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar7);
      poVar2 = std::operator<<(poVar2,")=");
      poStack_40 = (ostream *)0x63;
LAB_0011e41b:
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,(int)poStack_40,iVar6);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,99.0);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,9.0);
      poVar2 = std::operator<<(poVar2,")=");
      poStack_40 = (ostream *)0x63;
LAB_0011f374:
      iVar6 = 9;
LAB_0011f457:
      vVar8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,(int)poStack_40,iVar6);
    }
    poVar2 = rengine::operator<<((rengine *)poVar2,poStack_40,vVar8);
    pcVar3 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar3,
                                 (vec4)(ZEXT816(0x3f80000000000000) << 0x40));
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "false";
  }
LAB_0011e459:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                ,0xcb,"virtual void OpacityTextures::check()");
}

Assistant:

void check() override {
        check_pixelsOutside(rect2d::fromXywh(10, 10, 11, 11), vec4(0, 0, 0, 1));
        check_pixel(10, 10, vec4(0.5, 0, 0, 1));
        check_pixel(11, 10, vec4(0.5, 0, 0, 1));
        check_pixel(10, 11, vec4(0.5, 0, 0, 1));
        check_pixel(11, 11, vec4(0, 0, 0.5, 1));
        check_pixel(11, 12, vec4(0, 0, 0.5, 1));
        check_pixel(12, 11, vec4(0, 0, 0.5, 1));

        check_pixelsOutside(rect2d::fromXywh(31, 11, 11, 11), vec4(0, 0, 0, 1));
        check_pixel(31, 11, vec4(0, 0.5, 0, 1));
        check_pixel(32, 11, vec4(0, 0.5, 0, 1));
        check_pixel(31, 12, vec4(0, 0.5, 0, 1));
        check_pixel(32, 12, vec4(0.5, 0, 0, 1));
        check_pixel(33, 12, vec4(0.5, 0, 0, 1));
        check_pixel(32, 13, vec4(0.5, 0, 0, 1));

        check_pixelsOutside(rect2d::fromXywh(100, 10, 11, 11), vec4(0, 0, 0, 1));
        check_pixel(100, 10, vec4(0.64, 0, 0, 1));
        check_pixel(101, 11, vec4(0, 0, 0.64, 1));
        check_pixel(110, 20, vec4(0, 0, 0.64, 1));
        check_pixel(110, 10, vec4(0, 0, 0, 1));
        check_pixel(100, 20, vec4(0, 0, 0, 1));
    }